

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureView.h
# Opt level: O3

bool __thiscall Diligent::TextureViewDesc::operator==(TextureViewDesc *this,TextureViewDesc *RHS)

{
  bool bVar1;
  
  if ((((((this->ViewType == RHS->ViewType) && (this->TextureDim == RHS->TextureDim)) &&
        (this->Format == RHS->Format)) &&
       ((this->MostDetailedMip == RHS->MostDetailedMip && (this->NumMipLevels == RHS->NumMipLevels))
       )) && (((this->field_5).FirstArraySlice == (RHS->field_5).FirstArraySlice &&
              (((this->field_6).NumArraySlices == (RHS->field_6).NumArraySlices &&
               (this->AccessFlags == RHS->AccessFlags)))))) && (this->Flags == RHS->Flags)) {
    bVar1 = TextureComponentMapping::operator==(&this->Swizzle,&RHS->Swizzle);
    return bVar1;
  }
  return false;
}

Assistant:

constexpr bool operator==(const TextureViewDesc& RHS) const
    {
        // Ignore Name. This is consistent with the hasher (HashCombiner<HasherType, TextureViewDesc>).
        return //strcmp(Name, RHS.Name) == 0            &&
            ViewType                 == RHS.ViewType                 &&
            TextureDim               == RHS.TextureDim               &&
            Format                   == RHS.Format                   &&
            MostDetailedMip          == RHS.MostDetailedMip          &&
            NumMipLevels             == RHS.NumMipLevels             &&
            FirstArrayOrDepthSlice() == RHS.FirstArrayOrDepthSlice() &&
            NumArrayOrDepthSlices()  == RHS.NumArrayOrDepthSlices()  &&
            AccessFlags              == RHS.AccessFlags              &&
            Flags                    == RHS.Flags                    &&
            Swizzle                  == RHS.Swizzle;
    }